

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O2

bool __thiscall xray_re::xr_level_ps_static::load(xr_level_ps_static *this,char *path,char *name)

{
  xr_file_system *this_00;
  xr_reader *r;
  
  this_00 = xr_file_system::instance();
  r = xr_file_system::r_open(this_00,path,name);
  if (r != (xr_reader *)0x0) {
    load(this,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_level_ps_static::load(const char* path, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	load(*r);
	fs.r_close(r);
	return true;
}